

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

QPDFObjectHandle QPDFObjectHandle::newArray(Rectangle *rect)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar1;
  QPDFObjectHandle QVar2;
  initializer_list<QPDFObjectHandle> __l;
  bool in_stack_ffffffffffffff7b;
  int in_stack_ffffffffffffff7c;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_80;
  element_type *in_stack_ffffffffffffff98;
  
  newReal((double)in_stack_ffffffffffffff98,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff7b);
  newReal((double)in_stack_ffffffffffffff98,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff7b);
  newReal((double)in_stack_ffffffffffffff98,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff7b);
  newReal((double)in_stack_ffffffffffffff98,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff7b);
  __l._M_len = 4;
  __l._M_array = (iterator)&stack0xffffffffffffff98;
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector
            (&local_80,__l,(allocator_type *)&stack0xffffffffffffff7f);
  newArray((QPDFObjectHandle *)rect,&local_80);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_80);
  lVar1 = 0x38;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(&stack0xffffffffffffff98 + lVar1));
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -8);
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)rect;
  return (QPDFObjectHandle)
         QVar2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::newArray(Rectangle const& rect)
{
    return newArray({newReal(rect.llx), newReal(rect.lly), newReal(rect.urx), newReal(rect.ury)});
}